

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdset.c
# Opt level: O0

void TryRemovePollFd(fdset_s *self,sock fd)

{
  int local_1c;
  int local_18;
  int i;
  int pos;
  sock fd_local;
  fdset_s *self_local;
  
  local_18 = -1;
  local_1c = 0;
  do {
    if (self->nfds <= local_1c) {
LAB_001ac091:
      if (local_18 != -1) {
        memmove(self->pollFds + local_18,self->pollFds + (long)local_18 + 1,
                (long)((self->nfds - local_18) + -1) << 3);
        self->nfds = self->nfds + -1;
        if (self->nfds < 0) {
          __assert_fail("self->nfds >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/fdset.c"
                        ,0x53,"void TryRemovePollFd(struct fdset_s *, sock)");
        }
      }
      return;
    }
    if (self->pollFds[local_1c].fd == fd) {
      local_18 = local_1c;
      goto LAB_001ac091;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static
void TryRemovePollFd(struct fdset_s* self, sock fd)
{
    int pos = -1;
    int i = 0;
    for (; i < self->nfds; i++)
    {
        if(self->pollFds[i].fd == fd)
        {
            pos = i;
            break;
        }
    }

    if (pos != -1)
    {
        memmove(self->pollFds + pos, self->pollFds + pos + 1, sizeof(struct pollfd)*(self->nfds - pos - 1));
        self->nfds--;
        assert(self->nfds >= 0);
    }
}